

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O2

void __thiscall
LowererMDArch::GeneratePreCall
          (LowererMDArch *this,Instr *callInstr,Opnd *functionObjOpnd,
          Instr *insertBeforeInstrForCFGCheck)

{
  code *pcVar1;
  bool bVar2;
  DWORD offset;
  uint32 offset_00;
  RegOpnd *pRVar3;
  RegOpnd *pRVar4;
  IndirOpnd *pIVar5;
  Instr *pIVar6;
  AddrOpnd *pAVar7;
  undefined4 *puVar8;
  Opnd *dstOpnd;
  Func *func;
  IRType type;
  
  if (insertBeforeInstrForCFGCheck == (Instr *)0x0) {
    insertBeforeInstrForCFGCheck = callInstr;
  }
  if (callInstr->m_opcode == AsmJsCallI) {
    pRVar3 = IR::RegOpnd::New(TyInt64,this->m_func);
    pRVar4 = IR::Opnd::AsRegOpnd(functionObjOpnd);
    pIVar5 = IR::IndirOpnd::New(pRVar4,8,TyInt64,this->m_func,false);
    pIVar6 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar5->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar6);
    type = TyInt64;
    pIVar5 = IR::IndirOpnd::New(pRVar3,0x38,TyInt64,this->m_func,false);
    pIVar6 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar5->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar6);
    func = this->m_func;
    offset_00 = 0x10;
    goto LAB_005cc71d;
  }
  bVar2 = IR::Opnd::IsAddrOpnd(functionObjOpnd);
  if (bVar2) {
    pAVar7 = IR::Opnd::AsAddrOpnd(functionObjOpnd);
    if ((pAVar7->field_0x28 & 2) == 0) goto LAB_005cc5c9;
    pRVar3 = Lowerer::GenerateFunctionTypeFromFixedFunctionObject
                       (this->lowererMD->m_lowerer,insertBeforeInstrForCFGCheck,functionObjOpnd);
  }
  else {
LAB_005cc5c9:
    bVar2 = IR::Opnd::IsRegOpnd(functionObjOpnd);
    if (bVar2) {
      pRVar3 = IR::Opnd::AsRegOpnd(functionObjOpnd);
      if ((pRVar3->m_sym->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x2c2,"(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym())",
                           "Expected call target to be a stack symbol.");
        if (!bVar2) goto LAB_005cc78e;
        *puVar8 = 0;
      }
      pRVar3 = IR::RegOpnd::New(TyInt64,this->m_func);
      pRVar4 = IR::Opnd::AsRegOpnd(functionObjOpnd);
      offset = Js::DynamicObject::GetOffsetOfType();
      pIVar5 = IR::IndirOpnd::New(pRVar4,offset,TyInt64,this->m_func,false);
      pIVar6 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar5->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar6);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x2cf,"(false)","Unexpected call target operand type.");
      if (!bVar2) {
LAB_005cc78e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
      pRVar3 = (RegOpnd *)0x0;
    }
  }
  offset_00 = Js::Type::GetOffsetOfEntryPoint();
  func = this->m_func;
  type = TyUint64;
LAB_005cc71d:
  pIVar5 = IR::IndirOpnd::New(pRVar3,offset_00,type,func,false);
  pRVar3->field_0x18 = pRVar3->field_0x18 | 2;
  pIVar6 = IR::Instr::New(MOV,&pRVar3->super_Opnd,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertBeforeInstrForCFGCheck,pIVar6);
  IR::Instr::SetSrc1(callInstr,&pRVar3->super_Opnd);
  dstOpnd = GetArgSlotOpnd(this,1,(StackSym *)0x0,false);
  pIVar6 = IR::Instr::New(MOV,dstOpnd,functionObjOpnd,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar6);
  return;
}

Assistant:

void
LowererMDArch::GeneratePreCall(IR::Instr * callInstr, IR::Opnd  *functionObjOpnd, IR::Instr * insertBeforeInstrForCFGCheck)
{
    if (insertBeforeInstrForCFGCheck == nullptr)
    {
        insertBeforeInstrForCFGCheck = callInstr;
    }

    IR::RegOpnd * functionTypeRegOpnd = nullptr;
    IR::IndirOpnd * entryPointIndirOpnd = nullptr;
    if (callInstr->m_opcode == Js::OpCode::AsmJsCallI)
    {
        functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);

        IR::IndirOpnd* functionInfoIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);

        IR::Instr* instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);

        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        functionInfoIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::ScriptFunctionType::GetEntryPointInfoOffset(), TyMachReg, m_func);
        instr = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionInfoIndirOpnd, m_func);
        insertBeforeInstrForCFGCheck->InsertBefore(instr);

        uint32 entryPointOffset = Js::ProxyEntryPointInfo::GetAddressOffset();

        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, entryPointOffset, TyMachReg, m_func);
    }
    else
    {
        // For calls to fixed functions we load the function's type directly from the known (hard-coded) function object address.
        // For other calls, we need to load it from the function object stored in a register operand.
        if (functionObjOpnd->IsAddrOpnd() && functionObjOpnd->AsAddrOpnd()->m_isFunction)
        {
            functionTypeRegOpnd = this->lowererMD->m_lowerer->GenerateFunctionTypeFromFixedFunctionObject(insertBeforeInstrForCFGCheck, functionObjOpnd);
        }
        else if (functionObjOpnd->IsRegOpnd())
        {
            AssertMsg(functionObjOpnd->AsRegOpnd()->m_sym->IsStackSym(), "Expected call target to be a stack symbol.");

            functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
            // functionTypeRegOpnd(RAX) = MOV function->type
            {
                IR::IndirOpnd * functionTypeIndirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
                    Js::DynamicObject::GetOffsetOfType(), TyMachReg, m_func);
                IR::Instr * mov = IR::Instr::New(Js::OpCode::MOV, functionTypeRegOpnd, functionTypeIndirOpnd, m_func);
                insertBeforeInstrForCFGCheck->InsertBefore(mov);
            }
        }
        else
        {
            AnalysisAssertMsg(false, "Unexpected call target operand type.");
        }
        // entryPointRegOpnd(RAX) = MOV type->entryPoint
        entryPointIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::Type::GetOffsetOfEntryPoint(), TyMachPtr, m_func);
    }

    IR::RegOpnd *entryPointRegOpnd = functionTypeRegOpnd;
    entryPointRegOpnd->m_isCallArg = true;

    IR::Instr *mov = IR::Instr::New(Js::OpCode::MOV, entryPointRegOpnd, entryPointIndirOpnd, m_func);
    insertBeforeInstrForCFGCheck->InsertBefore(mov);

    // entryPointRegOpnd(RAX) = CALL entryPointRegOpnd(RAX)
    callInstr->SetSrc1(entryPointRegOpnd);

#if defined(_CONTROL_FLOW_GUARD)
    // verify that the call target is valid (CFG Check)
    if (!PHASE_OFF(Js::CFGInJitPhase, this->m_func))
    {
        this->lowererMD->GenerateCFGCheck(entryPointRegOpnd, insertBeforeInstrForCFGCheck);
    }
#endif

    // Setup the first call argument - pointer to the function being called.
    IR::Instr * instrMovArg1 = IR::Instr::New(Js::OpCode::MOV, GetArgSlotOpnd(1), functionObjOpnd, m_func);
    callInstr->InsertBefore(instrMovArg1);
}